

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O1

double fcdf(double x,int num,int den)

{
  char *__format;
  double dVar1;
  double dVar2;
  double dVar3;
  
  if ((num < 1) || (den < 1)) {
    __format = "Degrees Of Freedom should be positive real integers";
  }
  else {
    if (0.0 <= x) {
      dVar2 = (double)num;
      dVar3 = (double)den;
      dVar1 = x * dVar2;
      if (dVar1 < dVar3) {
        dVar1 = ibeta(dVar1 / (dVar1 + dVar3),dVar2 * 0.5,dVar3 * 0.5);
        return dVar1;
      }
      dVar1 = ibetac(dVar3 / (dVar1 + dVar3),dVar3 * 0.5,dVar2 * 0.5);
      return dVar1;
    }
    __format = "The range of distribution only takes non-negative and real values";
  }
  printf(__format);
  exit(1);
}

Assistant:

double fcdf(double x, int num,int den) {
	double oup,k1,k2,y;
	
	if (num <= 0 || den <= 0) {
		printf("Degrees Of Freedom should be positive real integers");
		exit(1);
	}
	
	if (x < 0.) {
		printf("The range of distribution only takes non-negative and real values");
		exit(1);
	}
	
	k1 = (double) num;
	k2 = (double) den;
	
	if (k1 * x < k2) {
		y = k1 * x / (k2 + k1 * x);
		oup = ibeta(y,k1/2.,k2/2.);
	} else {
		y = k2 / (k2 + k1 * x);
		oup = ibetac(y,k2/2.,k1/2.);
	}
	
	return oup;
}